

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rw_socket.cpp
# Opt level: O2

bool __thiscall cppnet::RWSocket::Write(RWSocket *this,char *src,uint32_t len)

{
  element_type *peVar1;
  _func_int **pp_Var2;
  undefined1 uVar3;
  int iVar4;
  uint uVar5;
  Event *pEVar6;
  shared_ptr<cppnet::EventActions> actions;
  __shared_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2> local_48;
  
  if (this->_event == (Event *)0x0) {
    pEVar6 = AlloterWrap::PoolNew<cppnet::Event>
                       ((this->_alloter).
                        super___shared_ptr<cppnet::AlloterWrap,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    this->_event = pEVar6;
    std::__shared_ptr<cppnet::RWSocket,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<cppnet::RWSocket,void>
              ((__shared_ptr<cppnet::RWSocket,(__gnu_cxx::_Lock_policy)2> *)&local_58,
               (__weak_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<cppnet::RWSocket>);
    local_48._M_ptr = (element_type *)local_58._M_ptr;
    local_48._M_refcount._M_pi = local_58._M_refcount._M_pi;
    local_58._M_ptr = (element_type *)0x0;
    local_58._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__weak_ptr<cppnet::Socket,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__weak_ptr<cppnet::Socket,(__gnu_cxx::_Lock_policy)2> *)&pEVar6->_socket,&local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  }
  iVar4 = (*(((this->_write_buffer).
              super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_InnerBuffer).super_Buffer._vptr_Buffer[8])();
  peVar1 = (this->_write_buffer).super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  pp_Var2 = (peVar1->super_InnerBuffer).super_Buffer._vptr_Buffer;
  if (iVar4 == 0) {
    (*pp_Var2[10])(peVar1,src,(ulong)len);
    uVar3 = Send(this);
  }
  else {
    uVar5 = (*pp_Var2[8])();
    if (uVar5 < 0x400001) {
      peVar1 = (this->_write_buffer).
               super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (*(peVar1->super_InnerBuffer).super_Buffer._vptr_Buffer[10])(peVar1,src,(ulong)len);
      std::__shared_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_58,&(this->super_Socket)._event_actions);
      if ((element_type *)local_58._M_ptr == (element_type *)0x0) {
        uVar3 = 0;
      }
      else {
        iVar4 = (*(local_58._M_ptr)->_vptr_EventActions[4])(local_58._M_ptr,this->_event);
        uVar3 = (undefined1)iVar4;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
    }
    else {
      uVar3 = 0;
    }
  }
  return (bool)uVar3;
}

Assistant:

bool RWSocket::Write(const char* src, uint32_t len) {
    if (!_event) {
        _event = _alloter->PoolNew<Event>();
        _event->SetSocket(shared_from_this());
    }

    //can't send now
    if (_write_buffer->GetCanReadLength() > 0) {
        if (_write_buffer->GetCanReadLength() > __max_write_cache) {
            return false;
        }
        
        _write_buffer->Write(src, len);
        auto actions = GetEventActions();
        if (actions) {
            return actions->AddSendEvent(_event);
        }
        return false;

    } else {
        _write_buffer->Write(src, len);
        return Send();
    }
}